

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlloader.c
# Opt level: O0

void * CMdlsym(void *vdlh,char *sym)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  char *__dest_00;
  char *in_RSI;
  undefined8 *in_RDI;
  char *tmp2;
  void *sym_val;
  char *tmp;
  dlhandle dlh;
  void *local_28;
  
  sVar1 = strlen(in_RSI);
  sVar2 = strlen((char *)in_RDI[1]);
  __dest = (char *)malloc(sVar1 + sVar2 + 3);
  strcpy(__dest,(char *)in_RDI[1]);
  strcat(__dest,in_RSI);
  local_28 = (void *)dlsym(*in_RDI,__dest);
  if (local_28 == (void *)0x0) {
    sVar1 = strlen(__dest);
    __dest_00 = (char *)malloc(sVar1 + 4);
    strcpy(__dest_00,"lib");
    strcat(__dest_00,__dest);
    local_28 = (void *)dlsym(*in_RDI,__dest_00);
    free(__dest_00);
  }
  free(__dest);
  if (local_28 == (void *)0x0) {
    local_28 = (void *)dlsym(*in_RDI,in_RSI);
  }
  return local_28;
}

Assistant:

void*
CMdlsym(void *vdlh, char *sym)
{
#if NO_DYNAMIC_LINKING
    return NULL;
#else
    dlhandle dlh = (dlhandle)vdlh;
    char *tmp = malloc(strlen(sym) + strlen(dlh->lib_prefix) + 3);
    void *sym_val;
    strcpy(tmp, dlh->lib_prefix);
    strcat(tmp, sym);
    sym_val = dlsym(dlh->dlopen_handle, tmp);
    if (!sym_val) {
      // try with lib prefix
      char *tmp2 = malloc(strlen(tmp) + 4);
      strcpy(tmp2, "lib");
      strcat(tmp2, tmp);
      sym_val = dlsym(dlh->dlopen_handle, tmp2);
      free(tmp2);
    }
    free(tmp);
    if (!sym_val) 
	sym_val = dlsym(dlh->dlopen_handle, sym);
    return sym_val;
#endif
}